

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Attack(Map *this,Character *from,Direction direction)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  Character *other;
  World *pWVar4;
  pointer ppNVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  EIF_Data *pEVar11;
  EIF_Data *pEVar12;
  mapped_type *pmVar13;
  ENF_Data *pEVar14;
  mapped_type *pmVar15;
  int iVar16;
  _List_node_base *p_Var17;
  undefined4 uVar18;
  undefined8 unaff_R12;
  Map *pMVar19;
  pointer ppNVar20;
  NPC *this_00;
  NPC *extraout_XMM0_Qa;
  double dVar21;
  double dVar22;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  NPC *local_150;
  key_type local_148;
  Map *local_128;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  formula_vars;
  key_type local_e0;
  key_type local_c0;
  PacketBuilder builder;
  string local_70;
  string local_50;
  
  pEVar11 = EIF::Get(this->world->eif,(from->paperdoll)._M_elems[8]);
  pEVar12 = EIF::Get(this->world->eif,(from->paperdoll)._M_elems[7]);
  if ((pEVar11->subtype == Ranged) && (pEVar12->subtype != Arrows)) {
    if (pEVar11->id != 0x16d) {
      return;
    }
    bVar6 = std::operator!=(&pEVar11->name,"Gun");
    if (bVar6) {
      return;
    }
  }
  from->direction = direction;
  from->attacks = from->attacks + 1;
  Character::CancelSpell(from);
  if (from->arena != (Arena *)0x0) {
    Arena::Attack(from->arena,from,direction);
  }
  if ((pEVar11->field_25).scrollmap != 0) {
    bVar6 = World::IsInstrument(this->world,(pEVar11->field_25).scrollmap);
    uVar18 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (bVar6) goto LAB_0015a8ab;
  }
  if (this->pk == false) {
    pWVar4 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&formula_vars,"GlobalPK",(allocator<char> *)&builder);
    pmVar13 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar4->config,(key_type *)&formula_vars);
    bVar6 = util::variant::GetBool(pmVar13);
    if (bVar6) {
      bVar6 = World::PKExcept(this->world,(int)this->id);
      std::__cxx11::string::~string((string *)&formula_vars);
      if (!bVar6) goto LAB_0015a828;
    }
    else {
      std::__cxx11::string::~string((string *)&formula_vars);
    }
    uVar18 = 0;
  }
  else {
LAB_0015a828:
    uVar18 = 0;
    bVar6 = AttackPK(this,from,DIRECTION_DOWN);
    if (bVar6) {
      return;
    }
  }
LAB_0015a8ab:
  local_150 = (NPC *)CONCAT44(local_150._4_4_,uVar18);
  PacketBuilder::PacketBuilder(&builder,PACKET_ATTACK,PACKET_PLAYER,3);
  iVar8 = Character::PlayerID(from);
  PacketBuilder::AddShort(&builder,iVar8);
  PacketBuilder::AddChar(&builder,(uint)direction);
  p_Var17 = (_List_node_base *)&this->characters;
  local_128 = this;
  while (pMVar19 = local_128,
        p_Var17 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var17->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var17 != (_List_node_base *)&this->characters) {
    other = (Character *)p_Var17[1]._M_next;
    if ((other != from) && (bVar6 = Character::InRange(from,other), bVar6)) {
      Character::Send(other,&builder);
    }
  }
  if (((char)local_150 == '\0') && ((from->nointeract & 4) == 0)) {
    uVar2 = (uint)from->x;
    uVar1 = (uint)from->y;
    if (pEVar11->subtype == Ranged) {
      pWVar4 = local_128->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&formula_vars,"RangedDistance",(allocator<char> *)&local_c0);
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar4->config,(key_type *)&formula_vars);
      iVar8 = util::variant::GetInt(pmVar13);
      std::__cxx11::string::~string((string *)&formula_vars);
    }
    else {
      iVar8 = 1;
    }
    iVar16 = 0;
    if (iVar8 < 1) {
      iVar8 = iVar16;
    }
    while (iVar16 != iVar8) {
      switch(from->direction) {
      case DIRECTION_DOWN:
        uVar1 = uVar1 + 1;
        break;
      case DIRECTION_LEFT:
        uVar2 = uVar2 - 1;
        break;
      case DIRECTION_UP:
        uVar1 = uVar1 - 1;
        break;
      case DIRECTION_RIGHT:
        uVar2 = uVar2 + 1;
      }
      ppNVar5 = (pMVar19->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppNVar20 = (pMVar19->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start; pMVar19 = local_128, ppNVar20 != ppNVar5;
          ppNVar20 = ppNVar20 + 1) {
        this_00 = *ppNVar20;
        pEVar14 = NPC::ENF(this_00);
        if ((pEVar14->type == Passive) || (pEVar14 = NPC::ENF(this_00), pEVar14->type == Aggressive)
           ) {
          bVar6 = false;
LAB_0015aa33:
          if ((this_00->alive == true) && (uVar2 == this_00->x)) {
            bVar3 = this_00->y;
            if (bVar6) {
              std::__cxx11::string::~string((string *)&local_c0);
            }
            if (uVar1 == bVar3) {
              iVar8 = util::rand();
              util::rand();
              pMVar19 = local_128;
              bVar6 = true;
              local_150 = extraout_XMM0_Qa;
              if ((((uint)this_00->direction - (uint)from->direction) + 2 & 0xfffffffb) == 0) {
                pWVar4 = local_128->world;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&formula_vars,"CriticalRate",(allocator<char> *)&local_148);
                pmVar13 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&pWVar4->config,(key_type *)&formula_vars);
                dVar21 = util::variant::GetFloat(pmVar13);
                bVar6 = (double)local_150 < dVar21;
                std::__cxx11::string::~string((string *)&formula_vars);
              }
              pWVar4 = pMVar19->world;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&formula_vars,"CriticalFirstHit",(allocator<char> *)&local_148);
              pmVar13 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&pWVar4->config,(key_type *)&formula_vars);
              bVar7 = util::variant::GetBool(pmVar13);
              if (bVar7) {
                iVar10 = this_00->hp;
                pEVar14 = NPC::ENF(this_00);
                iVar16 = pEVar14->hp;
                std::__cxx11::string::~string((string *)&formula_vars);
                bVar6 = (bool)(bVar6 | iVar10 == iVar16);
              }
              else {
                std::__cxx11::string::~string((string *)&formula_vars);
              }
              formula_vars._M_h._M_buckets = &formula_vars._M_h._M_single_bucket;
              formula_vars._M_h._M_bucket_count = 1;
              formula_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              formula_vars._M_h._M_element_count = 0;
              formula_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
              formula_vars._M_h._M_rehash_policy._M_next_resize = 0;
              formula_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"",(allocator<char> *)&local_148);
              Character::FormulaVars(from,&formula_vars,&local_50);
              pMVar19 = local_128;
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"target_",(allocator<char> *)&local_148);
              NPC::FormulaVars(this_00,&formula_vars,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              pWVar4 = pMVar19->world;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"MobRate",&local_152);
              pmVar13 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&pWVar4->config,&local_148);
              dVar21 = util::variant::GetFloat(pmVar13);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,"modifier",&local_153);
              pmVar15 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&formula_vars,&local_e0);
              *pmVar15 = dVar21;
              std::__cxx11::string::~string((string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"damage",(allocator<char> *)&local_e0);
              pmVar15 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&formula_vars,&local_148);
              *pmVar15 = (double)iVar8;
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"critical",(allocator<char> *)&local_e0);
              pmVar15 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&formula_vars,&local_148);
              *pmVar15 = (double)bVar6;
              std::__cxx11::string::~string((string *)&local_148);
              pWVar4 = pMVar19->world;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"damage",(allocator<char> *)&local_e0);
              dVar21 = World::EvalFormula(pWVar4,&local_148,&formula_vars);
              std::__cxx11::string::~string((string *)&local_148);
              pWVar4 = pMVar19->world;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"hit_rate",(allocator<char> *)&local_e0);
              dVar22 = World::EvalFormula(pWVar4,&local_148,&formula_vars);
              iVar8 = (int)dVar21;
              std::__cxx11::string::~string((string *)&local_148);
              if (iVar8 < 1) {
                iVar8 = 0;
              }
              if (dVar22 < (double)local_150) {
                iVar8 = 0;
              }
              iVar16 = this_00->hp;
              if (iVar8 <= this_00->hp) {
                iVar16 = iVar8;
              }
              pWVar4 = pMVar19->world;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"LimitDamage",(allocator<char> *)&local_e0);
              pmVar13 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&pWVar4->config,&local_148);
              bVar6 = util::variant::GetBool(pmVar13);
              std::__cxx11::string::~string((string *)&local_148);
              if (bVar6) {
                iVar8 = iVar16;
              }
              NPC::Damage(this_00,from,iVar8,-1);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&formula_vars._M_h);
              goto LAB_0015aece;
            }
          }
          else if (bVar6) goto LAB_0015aadd;
        }
        else {
          uVar9 = (*(from->super_Command_Source)._vptr_Command_Source[1])(from);
          pWVar4 = local_128->world;
          local_150 = this_00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"killnpc",&local_151);
          pmVar13 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar4->admin_config,&local_c0);
          iVar10 = util::variant::GetInt(pmVar13);
          bVar6 = true;
          this_00 = local_150;
          if (iVar10 <= (int)(uVar9 & 0xff)) goto LAB_0015aa33;
LAB_0015aadd:
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      bVar6 = Walkable(local_128,(uchar)uVar2,(uchar)uVar1,true);
      iVar16 = iVar16 + 1;
      if (!bVar6) break;
    }
  }
LAB_0015aece:
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Map::Attack(Character *from, Direction direction)
{
	const EIF_Data& wepdata = this->world->eif->Get(from->paperdoll[Character::Weapon]);
	const EIF_Data& shielddata = this->world->eif->Get(from->paperdoll[Character::Shield]);

	if (wepdata.subtype == EIF::Ranged && shielddata.subtype != EIF::Arrows)
	{
		// Ranged gun hack
		if (wepdata.id != 365 || wepdata.name != "Gun")
		{
			return;
		}
		// / Ranged gun hack
	}

	from->direction = direction;
	from->attacks += 1;

	from->CancelSpell();

	if (from->arena)
	{
		from->arena->Attack(from, direction);
	}

	int wep_graphic = wepdata.dollgraphic;
	bool is_instrument = (wep_graphic != 0 && this->world->IsInstrument(wep_graphic));

	if (!is_instrument && (this->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id))))
	{
		if (this->AttackPK(from, direction))
		{
			return;
		}
	}

	PacketBuilder builder(PACKET_ATTACK, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	if (is_instrument)
		return;

	if (!from->CanInteractCombat())
		return;

	int target_x = from->x;
	int target_y = from->y;

	int range = 1;

	if (wepdata.subtype == EIF::Ranged)
	{
		range = static_cast<int>(this->world->config["RangedDistance"]);
	}

	for (int i = 0; i < range; ++i)
	{
		switch (from->direction)
		{
			case DIRECTION_UP:
				target_y -= 1;
				break;

			case DIRECTION_RIGHT:
				target_x += 1;
				break;

			case DIRECTION_DOWN:
				target_y += 1;
				break;

			case DIRECTION_LEFT:
				target_x -= 1;
				break;
		}

		UTIL_FOREACH(this->npcs, npc)
		{
			if ((npc->ENF().type == ENF::Passive || npc->ENF().type == ENF::Aggressive || from->SourceDutyAccess() >= static_cast<int>(this->world->admin_config["killnpc"]))
			 && npc->alive && npc->x == target_x && npc->y == target_y)
			{
				int amount = util::rand(from->mindam, from->maxdam);
				double rand = util::rand(0.0, 1.0);
				// Checks if target is facing you
				bool critical = std::abs(int(npc->direction) - from->direction) != 2 || rand < static_cast<double>(this->world->config["CriticalRate"]);

				if (this->world->config["CriticalFirstHit"] && npc->hp == npc->ENF().hp)
					critical = true;

				std::unordered_map<std::string, double> formula_vars;

				from->FormulaVars(formula_vars);
				npc->FormulaVars(formula_vars, "target_");
				formula_vars["modifier"] = this->world->config["MobRate"];
				formula_vars["damage"] = amount;
				formula_vars["critical"] = critical;

				amount = this->world->EvalFormula("damage", formula_vars);
				double hit_rate = this->world->EvalFormula("hit_rate", formula_vars);

				if (rand > hit_rate)
				{
					amount = 0;
				}

				amount = std::max(amount, 0);

				int limitamount = std::min(amount, int(npc->hp));

				if (this->world->config["LimitDamage"])
				{
					amount = limitamount;
				}

				npc->Damage(from, amount);
				// *npc may not be valid here

				return;
			}
		}

		if (!this->Walkable(target_x, target_y, true))
		{
			return;
		}
	}
}